

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall test_cpp_db_sqlite::test_parameter::~test_parameter(test_parameter *this)

{
  test_parameter *this_local;
  
  SQLiteTestFixture::~SQLiteTestFixture(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_parameter)
{
    cpp_db::statement stmt(*con);
    BOOST_CHECK_NO_THROW(stmt.prepare("insert into TEST_TABLE(COL1, COL2) VALUES(?, ?)"));
    BOOST_CHECK_NO_THROW(stmt.execute_non_query(4, "four"));
    BOOST_CHECK_NO_THROW(stmt.execute_non_query(5, "five"));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::statement("select count(*) from TEST_TABLE where (COL1 = 4 and COL2 = 'four') OR (COL1 = 5 and COL2 = 'five')", *con).execute_scalar()), 2);

    BOOST_CHECK_NO_THROW(stmt.prepare("insert into TEST_TABLE(COL1, COL2) VALUES(99, 'Unknown')"));
    BOOST_CHECK_NO_THROW(stmt.execute_non_query());
    BOOST_CHECK_NO_THROW(stmt.execute_non_query());

    BOOST_CHECK_NO_THROW(stmt.execute_non_query());

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::statement("select count(*) from TEST_TABLE where COL1=99 and COL2='Unknown'", *con).execute_scalar()), 3);

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::statement("select count(*) from TEST_TABLE where COL1=? and COL2=?", *con).execute_scalar(99, "Unknown")), 3);
}